

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_spell_book_teleport_on_use.hpp
# Opt level: O0

void __thiscall
PatchSpellBookTeleportOnUse::inject_code(PatchSpellBookTeleportOnUse *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  Item *pIVar2;
  allocator<char> local_f1;
  uint32_t func_warp_to_start;
  uint local_cc;
  uint32_t func_pre_use_addr;
  DataRegister local_a8;
  undefined1 local_98 [8];
  Code func_pre_use;
  World *world_local;
  ROM *rom_local;
  PatchSpellBookTeleportOnUse *this_local;
  
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)world;
  md::Code::Code((Code *)local_98);
  if ((this->_consumable_spell_book & 1U) != 0) {
    md::DataRegister::DataRegister(&local_a8,'\0');
    addr_<void>((uint32_t)&stack0xffffffffffffff38,0xff1152);
    md::Code::moveb((Code *)local_98,(Param *)&local_a8,(Param *)&stack0xffffffffffffff38);
    md::Code::jsr((Code *)local_98,0x8b98);
  }
  md::Code::jmp((Code *)local_98,0x8bb2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&func_warp_to_start,"",&local_f1);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_98,(string *)&func_warp_to_start);
  std::__cxx11::string::~string((string *)&func_warp_to_start);
  std::allocator<char>::~allocator(&local_f1);
  local_cc = uVar1;
  pIVar2 = World::item((World *)func_pre_use._labels._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,'$');
  (*pIVar2->_vptr_Item[2])(pIVar2,(ulong)local_cc);
  uVar1 = inject_func_warp_to_start
                    (rom,(World *)func_pre_use._labels._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
  pIVar2 = World::item((World *)func_pre_use._labels._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,'$');
  (*pIVar2->_vptr_Item[3])(pIVar2,(ulong)uVar1);
  md::Code::~Code((Code *)local_98);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        // Replace "consume Spell Book" by a return indicating success and signaling there is a post-use effect
        // to handle.
        md::Code func_pre_use;
        if(_consumable_spell_book)
        {
            func_pre_use.moveb(reg_D0, addr_(0xFF1152));
            func_pre_use.jsr(0x8B98); // ConsumeItem
        }
        func_pre_use.jmp(offsets::PROC_ITEM_USE_RETURN_SUCCESS_HAS_POST_USE);
        uint32_t func_pre_use_addr = rom.inject_code(func_pre_use);
        world.item(ITEM_SPELL_BOOK)->pre_use_address(func_pre_use_addr);

        uint32_t func_warp_to_start = inject_func_warp_to_start(rom, world);
        world.item(ITEM_SPELL_BOOK)->post_use_address(func_warp_to_start);
    }